

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aatree.c
# Opt level: O2

Aatree * dodelete(DelInfo *info,Aatree *T,void **ret_value)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  Aatree *pAVar4;
  Aatree *pAVar5;
  long lStack_30;
  
  pAVar4 = &nil;
  if (T != &nil) {
    info->last = T;
    iVar3 = (*info->compare)(info->key,T->key);
    if (iVar3 < 0) {
      lStack_30 = 8;
    }
    else {
      info->deleted = T;
      lStack_30 = 0x10;
    }
    pAVar4 = dodelete(info,*(Aatree **)((long)&T->level + lStack_30),ret_value);
    *(Aatree **)((long)&T->level + lStack_30) = pAVar4;
    if (((info->last == T) && (info->deleted != &nil)) &&
       (iVar3 = (*info->compare)(info->key,info->deleted->key), iVar3 == 0)) {
      pAVar4 = T->right;
      *ret_value = info->deleted->value;
      pAVar5 = info->deleted;
      pvVar2 = T->value;
      pAVar5->key = T->key;
      pAVar5->value = pvVar2;
      info->deleted = &nil;
      al_free_with_context
                (T,0x8b,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/misc/aatree.c"
                 ,"dodelete");
    }
    else {
      iVar1 = T->level;
      iVar3 = iVar1 + -1;
      pAVar5 = T->right;
      if ((T->left->level < iVar3) || (pAVar4 = T, pAVar5->level < iVar3)) {
        T->level = iVar3;
        if (iVar1 <= pAVar5->level) {
          pAVar5->level = iVar3;
        }
        pAVar4 = skew(T);
        pAVar5 = skew(pAVar4->right);
        pAVar4->right = pAVar5;
        pAVar5 = skew(pAVar5->right);
        pAVar4->right->right = pAVar5;
        pAVar4 = split(pAVar4);
        pAVar5 = split(pAVar4->right);
        pAVar4->right = pAVar5;
      }
    }
  }
  return pAVar4;
}

Assistant:

static Aatree *dodelete(struct DelInfo *info, Aatree *T, void **ret_value)
{
   if (T == &nil)
      return T;

   /* Search down the tree and set pointers last and deleted. */
   info->last = T;
   if (info->compare(info->key, T->key) < 0) {
      T->left = dodelete(info, T->left, ret_value);
   }
   else {
      info->deleted = T;
      T->right = dodelete(info, T->right, ret_value);
   }

   /* At the bottom of the tree we remove the element if it is present. */
   if (T == info->last &&
      info->deleted != &nil &&
      info->compare(info->key, info->deleted->key) == 0)
   {
      Aatree *right = T->right;
      *ret_value = info->deleted->value;
      info->deleted->key = T->key;
      info->deleted->value = T->value;
      info->deleted = &nil;
      al_free(T);
      return right;
   }

   /* On the way back, we rebalance. */
   if (T->left->level < T->level - 1
      || T->right->level < T->level - 1)
   {
      T->level--;
      if (T->right->level > T->level) {
         T->right->level = T->level;
      }
      T = skew(T);
      T->right = skew(T->right);
      T->right->right = skew(T->right->right);
      T = split(T);
      T->right = split(T->right);
   }
   return T;
}